

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_element.c
# Opt level: O0

apx_error_t apx_dataElement_set_name_cstr(apx_dataElement_t *self,char *name)

{
  char *pcVar1;
  char *name_local;
  apx_dataElement_t *self_local;
  
  if (self == (apx_dataElement_t *)0x0) {
    self_local._4_4_ = 1;
  }
  else {
    pcVar1 = strdup(name);
    self->name = pcVar1;
    if (self->name == (char *)0x0) {
      self_local._4_4_ = 2;
    }
    else {
      self_local._4_4_ = 0;
    }
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_dataElement_set_name_cstr(apx_dataElement_t* self, const char* name)
{
   if (self != NULL)
   {
      self->name = STRDUP(name);
      if (self->name == NULL)
      {
         return APX_MEM_ERROR;
      }
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}